

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_bool mz_zip_writer_add_to_central_dir
                  (mz_zip_archive *pZip,char *pFilename,mz_uint16 filename_size,void *pExtra,
                  mz_uint16 extra_size,void *pComment,mz_uint16 comment_size,mz_uint64 uncomp_size,
                  mz_uint64 comp_size,mz_uint32 uncomp_crc32,mz_uint16 method,mz_uint16 bit_flags,
                  mz_uint16 dos_time,mz_uint16 dos_date,mz_uint64 param_15,mz_uint32 ext_attributes,
                  char *user_extra_data,mz_uint user_extra_data_len)

{
  mz_zip_internal_state *pArray;
  size_t sVar1;
  mz_bool mVar2;
  ulong uVar3;
  ulong uVar4;
  mz_uint64 mVar5;
  byte bVar6;
  ulong uVar7;
  undefined4 local_98;
  int local_94;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  mz_uint16 mStack_8c;
  undefined1 uStack_8a;
  undefined1 uStack_89;
  undefined1 uStack_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined8 local_84;
  undefined8 uStack_7c;
  undefined2 local_74;
  undefined1 local_72;
  undefined1 local_71;
  undefined1 local_70;
  undefined1 local_6f;
  undefined1 local_6e;
  undefined1 local_6d;
  undefined1 local_6c;
  undefined1 local_6b;
  mz_uint32 central_dir_ofs;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  void *local_48;
  void *local_40;
  char *local_38;
  
  pArray = pZip->m_pState;
  uVar4 = (pArray->m_central_dir).m_size;
  central_dir_ofs = (mz_uint32)uVar4;
  if ((param_15 >> 0x20 == 0) || (pArray->m_zip64 != 0)) {
    uVar3 = (ulong)filename_size;
    local_50 = (ulong)extra_size;
    local_58 = (ulong)user_extra_data_len;
    local_60 = (ulong)comment_size;
    if (local_50 + uVar3 + local_60 + local_58 + uVar4 + 0x2e < 0xffffffff) {
      local_74 = 0;
      bVar6 = 0x14;
      if (method == 0) {
        bVar6 = 0;
      }
      local_98 = 0x2014b50;
      _local_94 = CONCAT17((char)(method >> 8),
                           CONCAT16((char)method,
                                    CONCAT15((char)(bit_flags >> 8),
                                             CONCAT14((char)bit_flags,(uint)bVar6 << 0x10))));
      _mStack_8c = CONCAT17((char)(uncomp_crc32 >> 0x18),
                            CONCAT16((char)(uncomp_crc32 >> 0x10),
                                     CONCAT15((char)(uncomp_crc32 >> 8),
                                              CONCAT14((char)uncomp_crc32,
                                                       CONCAT13((char)(dos_date >> 8),
                                                                CONCAT12((char)dos_date,dos_time))))
                                    ));
      if (0xfffffffe < comp_size) {
        comp_size = 0xffffffff;
      }
      if (0xfffffffe < uncomp_size) {
        uncomp_size = 0xffffffff;
      }
      local_84 = CONCAT17((char)(uncomp_size >> 0x18),
                          CONCAT16((char)(uncomp_size >> 0x10),
                                   CONCAT15((char)(uncomp_size >> 8),
                                            CONCAT14((char)uncomp_size,(int)comp_size))));
      uStack_7c = (ulong)CONCAT15((char)(comment_size >> 8),
                                  CONCAT14((char)comment_size,
                                           CONCAT13((char)(user_extra_data_len + extra_size >> 8),
                                                    CONCAT12((char)(user_extra_data_len + extra_size
                                                                   ),filename_size))));
      local_72 = (undefined1)ext_attributes;
      local_71 = (undefined1)(ext_attributes >> 8);
      local_70 = (undefined1)(ext_attributes >> 0x10);
      local_6f = (undefined1)(ext_attributes >> 0x18);
      mVar5 = 0xffffffff;
      if (param_15 < 0xffffffff) {
        mVar5 = param_15;
      }
      local_6e = (undefined1)mVar5;
      local_6d = (undefined1)(mVar5 >> 8);
      local_6c = (undefined1)(mVar5 >> 0x10);
      local_6b = (undefined1)(mVar5 >> 0x18);
      uVar7 = uVar4 + 0x2e;
      local_48 = pComment;
      local_40 = pExtra;
      local_38 = pFilename;
      if ((uVar7 <= (pArray->m_central_dir).m_capacity) ||
         (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar7,1), mVar2 != 0)) {
        (pArray->m_central_dir).m_size = uVar7;
        uVar7 = (ulong)(pArray->m_central_dir).m_element_size;
        memcpy((void *)(uVar4 * uVar7 + (long)(pArray->m_central_dir).m_p),&local_98,uVar7 * 0x2e);
        sVar1 = (pArray->m_central_dir).m_size;
        uVar7 = sVar1 + uVar3;
        if ((uVar7 <= (pArray->m_central_dir).m_capacity) ||
           (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar7,1), mVar2 != 0))
        {
          (pArray->m_central_dir).m_size = uVar7;
          uVar7 = (ulong)(pArray->m_central_dir).m_element_size;
          memcpy((void *)(sVar1 * uVar7 + (long)(pArray->m_central_dir).m_p),local_38,uVar3 * uVar7)
          ;
          sVar1 = (pArray->m_central_dir).m_size;
          uVar3 = local_50 + sVar1;
          if ((uVar3 <= (pArray->m_central_dir).m_capacity) ||
             (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar3,1), mVar2 != 0)
             ) {
            (pArray->m_central_dir).m_size = uVar3;
            uVar3 = (ulong)(pArray->m_central_dir).m_element_size;
            memcpy((void *)(sVar1 * uVar3 + (long)(pArray->m_central_dir).m_p),local_40,
                   local_50 * uVar3);
            sVar1 = (pArray->m_central_dir).m_size;
            uVar3 = sVar1 + local_58;
            if ((uVar3 <= (pArray->m_central_dir).m_capacity) ||
               (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar3,1),
               mVar2 != 0)) {
              (pArray->m_central_dir).m_size = uVar3;
              uVar3 = (ulong)(pArray->m_central_dir).m_element_size;
              memcpy((void *)(sVar1 * uVar3 + (long)(pArray->m_central_dir).m_p),user_extra_data,
                     local_58 * uVar3);
              sVar1 = (pArray->m_central_dir).m_size;
              uVar3 = sVar1 + local_60;
              if ((uVar3 <= (pArray->m_central_dir).m_capacity) ||
                 (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar3,1),
                 mVar2 != 0)) {
                (pArray->m_central_dir).m_size = uVar3;
                uVar3 = (ulong)(pArray->m_central_dir).m_element_size;
                memcpy((void *)(sVar1 * uVar3 + (long)(pArray->m_central_dir).m_p),local_48,
                       local_60 * uVar3);
                sVar1 = (pArray->m_central_dir_offsets).m_size;
                uVar3 = sVar1 + 1;
                if ((uVar3 <= (pArray->m_central_dir_offsets).m_capacity) ||
                   (mVar2 = mz_zip_array_ensure_capacity
                                      (pZip,&pArray->m_central_dir_offsets,uVar3,1), mVar2 != 0)) {
                  (pArray->m_central_dir_offsets).m_size = uVar3;
                  uVar4 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
                  memcpy((void *)(sVar1 * uVar4 + (long)(pArray->m_central_dir_offsets).m_p),
                         &central_dir_ofs,uVar4);
                  return 1;
                }
              }
            }
          }
        }
      }
      if ((uVar4 <= (pArray->m_central_dir).m_capacity) ||
         (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar4,0), mVar2 != 0)) {
        (pArray->m_central_dir).m_size = uVar4;
      }
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    }
    else {
      pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    }
  }
  else {
    pZip->m_last_error = MZ_ZIP_FILE_TOO_LARGE;
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_writer_add_to_central_dir(mz_zip_archive *pZip, const char *pFilename, mz_uint16 filename_size,
                                                const void *pExtra, mz_uint16 extra_size, const void *pComment, mz_uint16 comment_size,
                                                mz_uint64 uncomp_size, mz_uint64 comp_size, mz_uint32 uncomp_crc32,
                                                mz_uint16 method, mz_uint16 bit_flags, mz_uint16 dos_time, mz_uint16 dos_date,
                                                mz_uint64 local_header_ofs, mz_uint32 ext_attributes,
                                                const char *user_extra_data, mz_uint user_extra_data_len)
{
    mz_zip_internal_state *pState = pZip->m_pState;
    mz_uint32 central_dir_ofs = (mz_uint32)pState->m_central_dir.m_size;
    size_t orig_central_dir_size = pState->m_central_dir.m_size;
    mz_uint8 central_dir_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];

    if (!pZip->m_pState->m_zip64)
    {
        if (local_header_ofs > 0xFFFFFFFF)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_TOO_LARGE);
    }

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + extra_size + user_extra_data_len + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!mz_zip_writer_create_central_dir_header(pZip, central_dir_header, filename_size, extra_size + user_extra_data_len, comment_size, uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time, dos_date, local_header_ofs, ext_attributes))
        return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    if ((!mz_zip_array_push_back(pZip, &pState->m_central_dir, central_dir_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)) ||
        (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pFilename, filename_size)) ||
        (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pExtra, extra_size)) ||
        (!mz_zip_array_push_back(pZip, &pState->m_central_dir, user_extra_data, user_extra_data_len)) ||
        (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pComment, comment_size)) ||
        (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &central_dir_ofs, 1)))
    {
        /* Try to resize the central directory array back into its original state. */
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    return MZ_TRUE;
}